

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O3

void RescalerExportRowShrink_SSE2(WebPRescaler *wrk)

{
  uint uVar1;
  uint8_t *puVar2;
  rescaler_t *prVar3;
  rescaler_t *prVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  rescaler_t rVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  __m128i mult_xy;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i A1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i A1_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i A0;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  auVar19 = _DAT_00151e00;
  puVar2 = wrk->dst;
  uVar20 = wrk->num_channels * wrk->dst_width;
  prVar3 = wrk->irow;
  iVar21 = wrk->y_accum * wrk->fy_scale;
  uVar1 = wrk->fxy_scale;
  if (iVar21 == 0) {
    uVar27 = 0;
    if (7 < (int)uVar20) {
      uVar23 = 0;
      do {
        uVar27 = *(ulong *)(prVar3 + uVar23);
        uVar25 = *(ulong *)((long)(prVar3 + uVar23) + 8);
        uVar13 = *(ulong *)(prVar3 + uVar23 + 4);
        uVar14 = *(ulong *)((long)(prVar3 + uVar23 + 4) + 8);
        auVar29._0_8_ = (uVar27 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar29._8_8_ = (uVar25 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar35._0_8_ = (uVar13 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar35._8_8_ = (uVar14 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar31._0_8_ = (uVar27 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar31._8_8_ = (uVar25 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar33._0_8_ = (uVar13 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar33._8_8_ = (uVar14 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar29 = packssdw(auVar29 & auVar19 | auVar31,auVar35 & auVar19 | auVar33);
        sVar5 = auVar29._0_2_;
        sVar6 = auVar29._2_2_;
        sVar7 = auVar29._4_2_;
        sVar8 = auVar29._6_2_;
        sVar9 = auVar29._8_2_;
        sVar10 = auVar29._10_2_;
        sVar11 = auVar29._12_2_;
        sVar12 = auVar29._14_2_;
        *(undefined1 (*) [16])(prVar3 + uVar23) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(prVar3 + uVar23 + 4) = (undefined1  [16])0x0;
        *(ulong *)(puVar2 + uVar23) =
             CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar29[0xe] - (0xff < sVar12),
                      CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar29[0xc] - (0xff < sVar11),
                               CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar29[10] -
                                        (0xff < sVar10),
                                        CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar29[8] -
                                                 (0xff < sVar9),
                                                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar29[6]
                                                          - (0xff < sVar8),
                                                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                   auVar29[4] - (0xff < sVar7),
                                                                   CONCAT11((0 < sVar6) *
                                                                            (sVar6 < 0x100) *
                                                                            auVar29[2] -
                                                                            (0xff < sVar6),
                                                                            (0 < sVar5) *
                                                                            (sVar5 < 0x100) *
                                                                            auVar29[0] -
                                                                            (0xff < sVar5))))))));
        uVar27 = uVar23 + 8;
        uVar25 = uVar23 + 0x10;
        uVar23 = uVar27;
      } while (uVar25 <= uVar20);
    }
    if ((int)uVar27 < (int)uVar20) {
      uVar27 = uVar27 & 0xffffffff;
      do {
        iVar21 = (int)((ulong)prVar3[uVar27] * (ulong)uVar1 + 0x80000000 >> 0x20);
        if (0xff < iVar21) {
          iVar21 = 0xff;
        }
        puVar2[uVar27] = (uint8_t)iVar21;
        prVar3[uVar27] = 0;
        uVar27 = uVar27 + 1;
      } while (uVar20 != uVar27);
    }
  }
  else {
    prVar4 = wrk->frow;
    uVar22 = -iVar21;
    uVar27 = 0;
    if (7 < (int)uVar20) {
      uVar23 = 0;
      do {
        uVar27 = *(ulong *)(prVar3 + uVar23);
        uVar25 = *(ulong *)((long)(prVar3 + uVar23) + 8);
        uVar13 = *(ulong *)(prVar3 + uVar23 + 4);
        uVar14 = *(ulong *)((long)(prVar3 + uVar23 + 4) + 8);
        uVar15 = *(ulong *)(prVar4 + uVar23);
        uVar16 = *(ulong *)((long)(prVar4 + uVar23) + 8);
        uVar17 = *(ulong *)(prVar4 + uVar23 + 4);
        uVar18 = *(ulong *)((long)(prVar4 + uVar23 + 4) + 8);
        auVar36._0_8_ = (uVar15 >> 0x20) * (ulong)uVar22;
        auVar36._8_8_ = (uVar16 >> 0x20) * (ulong)uVar22;
        auVar38._0_8_ = (uVar17 >> 0x20) * (ulong)uVar22;
        auVar38._8_8_ = (uVar18 >> 0x20) * (ulong)uVar22;
        auVar39._0_8_ = (uVar15 & 0xffffffff) * (ulong)uVar22 >> 0x20;
        auVar39._8_8_ = (uVar16 & 0xffffffff) * (ulong)uVar22 >> 0x20;
        auVar37._0_8_ = (uVar17 & 0xffffffff) * (ulong)uVar22 >> 0x20;
        auVar37._8_8_ = (uVar18 & 0xffffffff) * (ulong)uVar22 >> 0x20;
        *(undefined1 (*) [16])(prVar3 + uVar23) = auVar36 & auVar19 | auVar39;
        *(undefined1 (*) [16])(prVar3 + uVar23 + 4) = auVar38 & auVar19 | auVar37;
        auVar28._0_8_ =
             ((uVar27 >> 0x20) - (auVar36._0_8_ >> 0x20) & 0xffffffff) * (ulong)uVar1 + 0x80000000;
        auVar28._8_8_ =
             ((uVar25 >> 0x20) - (auVar36._8_8_ >> 0x20) & 0xffffffff) * (ulong)uVar1 + 0x80000000;
        auVar32._0_8_ =
             ((uVar13 >> 0x20) - (auVar38._0_8_ >> 0x20) & 0xffffffff) * (ulong)uVar1 + 0x80000000;
        auVar32._8_8_ =
             ((uVar14 >> 0x20) - (auVar38._8_8_ >> 0x20) & 0xffffffff) * (ulong)uVar1 + 0x80000000;
        auVar34._0_8_ = (uVar27 - auVar39._0_8_ & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar34._8_8_ = (uVar25 - auVar39._8_8_ & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar30._0_8_ = (uVar13 - auVar37._0_8_ & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar30._8_8_ = (uVar14 - auVar37._8_8_ & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar29 = packssdw(auVar28 & auVar19 | auVar34,auVar32 & auVar19 | auVar30);
        sVar5 = auVar29._0_2_;
        sVar6 = auVar29._2_2_;
        sVar7 = auVar29._4_2_;
        sVar8 = auVar29._6_2_;
        sVar9 = auVar29._8_2_;
        sVar10 = auVar29._10_2_;
        sVar11 = auVar29._12_2_;
        sVar12 = auVar29._14_2_;
        *(ulong *)(puVar2 + uVar23) =
             CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar29[0xe] - (0xff < sVar12),
                      CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar29[0xc] - (0xff < sVar11),
                               CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar29[10] -
                                        (0xff < sVar10),
                                        CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar29[8] -
                                                 (0xff < sVar9),
                                                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar29[6]
                                                          - (0xff < sVar8),
                                                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                   auVar29[4] - (0xff < sVar7),
                                                                   CONCAT11((0 < sVar6) *
                                                                            (sVar6 < 0x100) *
                                                                            auVar29[2] -
                                                                            (0xff < sVar6),
                                                                            (0 < sVar5) *
                                                                            (sVar5 < 0x100) *
                                                                            auVar29[0] -
                                                                            (0xff < sVar5))))))));
        uVar27 = uVar23 + 8;
        uVar25 = uVar23 + 0x10;
        uVar23 = uVar27;
      } while (uVar25 <= uVar20);
    }
    if ((int)uVar27 < (int)uVar20) {
      uVar27 = uVar27 & 0xffffffff;
      do {
        rVar24 = (rescaler_t)((ulong)prVar4[uVar27] * (ulong)uVar22 >> 0x20);
        iVar26 = (int)((ulong)wrk->fxy_scale * (ulong)(prVar3[uVar27] - rVar24) + 0x80000000 >> 0x20
                      );
        iVar21 = 0xff;
        if (iVar26 < 0x100) {
          iVar21 = iVar26;
        }
        puVar2[uVar27] = (uint8_t)iVar21;
        prVar3[uVar27] = rVar24;
        uVar27 = uVar27 + 1;
      } while (uVar20 != uVar27);
    }
  }
  return;
}

Assistant:

static void RescalerExportRowShrink_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    const int scale_xy = wrk->fxy_scale;
    const __m128i mult_xy = _mm_set_epi32(0, scale_xy, 0, scale_xy);
    const __m128i mult_y = _mm_set_epi32(0, yscale, 0, yscale);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(frow + x_out, &mult_y, &B0, &B1, &B2, &B3);
      {
        const __m128i D0 = _mm_srli_epi64(B0, WEBP_RESCALER_RFIX);   // = frac
        const __m128i D1 = _mm_srli_epi64(B1, WEBP_RESCALER_RFIX);
        const __m128i D2 = _mm_srli_epi64(B2, WEBP_RESCALER_RFIX);
        const __m128i D3 = _mm_srli_epi64(B3, WEBP_RESCALER_RFIX);
        const __m128i E0 = _mm_sub_epi64(A0, D0);   // irow[x] - frac
        const __m128i E1 = _mm_sub_epi64(A1, D1);
        const __m128i E2 = _mm_sub_epi64(A2, D2);
        const __m128i E3 = _mm_sub_epi64(A3, D3);
        const __m128i F2 = _mm_slli_epi64(D2, 32);
        const __m128i F3 = _mm_slli_epi64(D3, 32);
        const __m128i G0 = _mm_or_si128(D0, F2);
        const __m128i G1 = _mm_or_si128(D1, F3);
        _mm_storeu_si128((__m128i*)(irow + x_out + 0), G0);
        _mm_storeu_si128((__m128i*)(irow + x_out + 4), G1);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult_xy, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (int)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    const uint32_t scale = wrk->fxy_scale;
    const __m128i mult = _mm_set_epi32(0, scale, 0, scale);
    const __m128i zero = _mm_setzero_si128();
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      _mm_storeu_si128((__m128i*)(irow + x_out + 0), zero);
      _mm_storeu_si128((__m128i*)(irow + x_out + 4), zero);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}